

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall tok_embed_ctx::start_expr(tok_embed_ctx *this,wchar_t qu,int triple,int report)

{
  long lVar1;
  
  lVar1 = (long)this->level;
  if (lVar1 < 10) {
    this->s = this->stk + lVar1;
    this->stk[lVar1].parens = 0;
    this->stk[lVar1].endtok = (uint)(qu == L'\"') * 4 + TOKT_SSTR_END;
    this->stk[lVar1].qu = qu;
    this->stk[lVar1].triple = triple;
  }
  else if (report != 0) {
    CTcTokenizer::log_error(0x2754);
  }
  this->level = this->level + 1;
  return;
}

Assistant:

void tok_embed_ctx::start_expr(wchar_t qu, int triple, int report)
{
	if (level < (int)countof(stk))
    {
        s = stk + level;
        s->enter(qu, triple);
    }
    else if (report)
    {
        G_tok->log_error(TCERR_EMBEDDING_TOO_DEEP);
    }
    ++level;
}